

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O1

bool legacy::getSlicingCriteriaNodes
               (LLVMDependenceGraph *dg,string *slicingCriteria,string *secondarySlicingCriteria,
               set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
               *criteria_nodes,bool criteria_are_next_instr)

{
  undefined8 *puVar1;
  undefined2 *puVar2;
  undefined4 *puVar3;
  pointer pcVar4;
  string *psVar5;
  pointer ppVar6;
  _Rb_tree_node_base *p_Var7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  _Rb_tree_node_base *p_Var13;
  char *pcVar14;
  long lVar15;
  Instruction *I;
  raw_ostream *prVar16;
  long lVar17;
  _Base_ptr p_Var18;
  pointer pbVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  ulong uVar21;
  long lVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  undefined1 auVar23 [8];
  char *pcVar24;
  undefined3 in_register_00000081;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *c_2;
  Value *V;
  iterator __begin1;
  pointer opt;
  iterator __end1;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  pair<std::_Rb_tree_iterator<dg::BBlock<dg::LLVMNode>_*>,_bool> pVar28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  line_criteria;
  int line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  node_criteria;
  pair<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  secondaryCriteria;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  control_criteria;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parsedCrit;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  criteria;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  _Rb_tree_node_base *local_1f8;
  _Rb_tree_node_base *local_1f0;
  _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
  *local_1e8;
  int local_1dc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  local_1b8;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_168;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  undefined4 local_11c;
  undefined1 local_118 [16];
  _Link_type local_108;
  _Base_ptr p_Stack_100;
  _Base_ptr local_f8;
  _Map_pointer pppBStack_f0;
  _Base_ptr local_e8;
  _Base_ptr p_Stack_e0;
  _Base_ptr local_d8;
  _Map_pointer pppBStack_d0;
  _Rb_tree_node_base *local_c8;
  long local_c0;
  undefined1 local_b8 [8];
  pointer ppStack_b0;
  _Link_type local_a8;
  _Base_ptr local_a0;
  _Base_ptr local_98;
  size_t local_90;
  string *local_80;
  _Rb_tree_node_base *local_78;
  long local_70;
  long local_68;
  undefined1 local_60 [8];
  _Rb_tree_node_base local_58;
  
  local_11c = CONCAT31(in_register_00000081,criteria_are_next_instr);
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1b8._M_impl.super__Rb_tree_header._M_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f8 = (_Rb_tree_node_base *)dg;
  local_1e8 = (_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
               *)criteria_nodes;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_80 = secondarySlicingCriteria;
  splitList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60,slicingCriteria,',');
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._0_8_ = (void *)0x0;
  local_118._8_8_ = 0;
  p_Stack_100 = (_Base_ptr)
                std::
                _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/tools/llvm-slicer-crit.cpp:931:41)>
                ::_M_invoke;
  local_108 = (_Link_type)
              std::
              _Function_handler<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/tools/llvm-slicer-crit.cpp:931:41)>
              ::_M_manager;
  splitStringVector((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_188,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_60,
                    (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)local_118);
  local_a8 = (_Link_type)
             local_218.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppStack_b0 = (pointer)local_218.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = (undefined1  [8])
             local_218.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_188._0_8_;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_188._8_8_;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_178._0_8_;
  local_188._0_8_ = (pointer)0x0;
  local_188._8_8_ = (pointer)0x0;
  local_178._0_8_ = (_Link_type)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b8);
  local_a8 = (_Link_type)
             local_1d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppStack_b0 = (pointer)local_1d8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = (undefined1  [8])
             local_1d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_178._8_8_;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)aStack_168._M_allocated_capacity;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aStack_168._8_8_;
  local_178._8_8_ = (_Rb_tree_node_base *)0x0;
  aStack_168._M_allocated_capacity = 0;
  aStack_168._8_8_ = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_178 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_188);
  if (local_108 != (_Link_type)0x0) {
    (*(code *)local_108)(local_118,local_118,3);
  }
  pbVar19 = local_1d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var18 = (_Base_ptr)
              local_1d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar11 = std::__cxx11::string::compare((char *)p_Var18);
      if (iVar11 == 0) {
        lVar15 = *(long *)(local_1f8 + 1);
        for (p_Var13 = *(_Rb_tree_node_base **)(lVar15 + 0xe8);
            p_Var13 != (_Rb_tree_node_base *)(lVar15 + 0xd8);
            p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
          std::
          _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
          ::_M_insert_unique<dg::LLVMNode*const&>
                    ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                      *)&local_1b8,(LLVMNode **)(p_Var13 + 1));
        }
      }
      p_Var18 = p_Var18 + 1;
    } while (p_Var18 != (_Base_ptr)pbVar19);
  }
  if (local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::dg::LLVMDependenceGraph::getCallSites((vector *)&local_1d8,(set *)&local_1b8);
  }
  pbVar19 = local_218.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_b8 = (undefined1  [8])0x0;
    ppStack_b0 = (pointer)0x0;
    local_a8 = (_Link_type)0x0;
    opt = local_218.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      splitList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_188,opt,':');
      uVar8 = local_188._0_8_;
      if (*(ulong *)(local_188._0_8_ + 8) == 0) {
        local_1dc = -1;
        std::
        vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
        ::emplace_back<int,std::__cxx11::string&>
                  ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                    *)local_b8,&local_1dc,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_188._0_8_ + 0x20));
      }
      else {
        pcVar14 = *(char **)local_188._0_8_;
        if ((int)*pcVar14 - 0x30U < 10) {
          uVar21 = 1;
          do {
            if (*(ulong *)(local_188._0_8_ + 8) == uVar21) {
              local_1dc = atoi(pcVar14);
              if (0 < local_1dc) {
                std::
                vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                ::emplace_back<int&,std::__cxx11::string&>
                          ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                            *)local_b8,&local_1dc,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (uVar8 + 0x20));
              }
              goto LAB_00125638;
            }
            pcVar24 = pcVar14 + uVar21;
            uVar21 = uVar21 + 1;
          } while ((int)*pcVar24 - 0x30U < 10);
        }
        pcVar14 = (char *)llvm::errs();
        puVar1 = *(undefined8 **)(pcVar14 + 0x20);
        if ((ulong)(*(long *)(pcVar14 + 0x18) - (long)puVar1) < 0xf) {
          pcVar14 = (char *)llvm::raw_ostream::write(pcVar14,0x12c78a);
        }
        else {
          *(undefined8 *)((long)puVar1 + 7) = 0x27203a656e696c20;
          *puVar1 = 0x2064696c61766e49;
          *(long *)(pcVar14 + 0x20) = *(long *)(pcVar14 + 0x20) + 0xf;
        }
        pcVar14 = (char *)llvm::raw_ostream::write(pcVar14,*(ulong *)local_188._0_8_);
        puVar2 = *(undefined2 **)(pcVar14 + 0x20);
        if ((ulong)(*(long *)(pcVar14 + 0x18) - (long)puVar2) < 3) {
          pcVar14 = (char *)llvm::raw_ostream::write(pcVar14,0x12c79a);
        }
        else {
          *(undefined1 *)(puVar2 + 1) = 0x20;
          *puVar2 = 0x2e27;
          *(long *)(pcVar14 + 0x20) = *(long *)(pcVar14 + 0x20) + 3;
        }
        if ((ulong)(*(long *)(pcVar14 + 0x18) - (long)*(char **)(pcVar14 + 0x20)) < 0x34) {
          llvm::raw_ostream::write(pcVar14,0x12c79e);
        }
        else {
          builtin_strncpy(*(char **)(pcVar14 + 0x20),
                          "Needs to be a number or empty for global variables.\n",0x34);
          *(long *)(pcVar14 + 0x20) = *(long *)(pcVar14 + 0x20) + 0x34;
        }
      }
LAB_00125638:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_188);
      p_Var13 = local_1f8;
      opt = opt + 1;
    } while (opt != pbVar19);
    initDebugInfo((LLVMDependenceGraph *)local_1f8);
    lVar15 = *(long *)(p_Var13 + 10);
    auVar23 = local_b8;
    ppVar6 = ppStack_b0;
    for (lVar22 = *(long *)(lVar15 + 0x10); local_b8 = auVar23, ppStack_b0 = ppVar6,
        lVar22 != lVar15 + 8; lVar22 = *(long *)(lVar22 + 8)) {
      prVar16 = (raw_ostream *)(lVar22 + -0x38);
      if (lVar22 == 0) {
        prVar16 = (raw_ostream *)0x0;
      }
      bVar25 = auVar23 != (undefined1  [8])ppVar6;
      if (bVar25) {
        bVar25 = true;
        do {
          iVar11 = 3;
          if (*(int *)&((_Alloc_hider *)&((pointer)auVar23)->first)->_M_p == -1) {
            auVar27 = llvm::Value::getName();
            lVar17 = auVar27._0_8_;
            if (lVar17 == 0) {
              local_188._0_8_ = local_178;
              local_188._8_8_ = (pointer)0x0;
              local_178._0_8_ = local_178._0_8_ & 0xffffffffffffff00;
            }
            else {
              local_188._0_8_ = local_178;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_188,lVar17,auVar27._8_8_ + lVar17);
            }
            pbVar19 = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)&(((pointer)auVar23)->second)._M_string_length)->
                               _M_allocated_capacity;
            if (pbVar19 == (pointer)local_188._8_8_) {
              if (pbVar19 == (pointer)0x0) {
                bVar26 = true;
              }
              else {
                iVar11 = bcmp((((pointer)auVar23)->second)._M_dataplus._M_p,(void *)local_188._0_8_,
                              (size_t)pbVar19);
                bVar26 = iVar11 == 0;
              }
            }
            else {
              bVar26 = false;
            }
            if ((pointer)local_188._0_8_ != (pointer)local_178) {
              operator_delete((void *)local_188._0_8_,(ulong)(local_178._0_8_ + 1));
            }
            iVar11 = 0;
            if (bVar26) {
              pcVar14 = (char *)llvm::errs();
              if ((ulong)(*(long *)(pcVar14 + 0x18) - (long)*(char **)(pcVar14 + 0x20)) < 0x18) {
                pcVar14 = (char *)llvm::raw_ostream::write(pcVar14,0x12c7d3);
              }
              else {
                builtin_strncpy(*(char **)(pcVar14 + 0x20),"Matched global variable ",0x18);
                *(long *)(pcVar14 + 0x20) = *(long *)(pcVar14 + 0x20) + 0x18;
              }
              pcVar14 = (char *)llvm::raw_ostream::write
                                          (pcVar14,(ulong)(((pointer)auVar23)->second)._M_dataplus.
                                                          _M_p);
              puVar3 = *(undefined4 **)(pcVar14 + 0x20);
              if ((ulong)(*(long *)(pcVar14 + 0x18) - (long)puVar3) < 5) {
                pcVar14 = (char *)llvm::raw_ostream::write(pcVar14,0x12c7ec);
              }
              else {
                *(undefined1 *)(puVar3 + 1) = 10;
                *puVar3 = 0x3a6f7420;
                *(long *)(pcVar14 + 0x20) = *(long *)(pcVar14 + 0x20) + 5;
              }
              llvm::Value::print(prVar16,SUB81(pcVar14,0));
              if (*(undefined1 **)(pcVar14 + 0x18) == *(undefined1 **)(pcVar14 + 0x20)) {
                llvm::raw_ostream::write(pcVar14,0x12c650);
              }
              else {
                **(undefined1 **)(pcVar14 + 0x20) = 10;
                *(long *)(pcVar14 + 0x20) = *(long *)(pcVar14 + 0x20) + 1;
              }
              iVar11 = 1;
            }
          }
          if ((iVar11 != 3) && (iVar11 != 0)) break;
          auVar23 = (undefined1  [8])((long)auVar23 + 0x28);
          bVar25 = auVar23 != (undefined1  [8])ppVar6;
        } while (bVar25);
      }
      if (bVar25) {
        local_188._0_8_ =
             ::dg::DependenceGraph<dg::LLVMNode>::_getGlobalNode<llvm::Value*>
                       ((DependenceGraph<dg::LLVMNode> *)local_1f8,(Value *)prVar16);
        std::
        _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
        ::_M_insert_unique<dg::LLVMNode*const&>
                  ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                    *)&local_1b8,(LLVMNode **)local_188);
      }
      auVar23 = local_b8;
      ppVar6 = ppStack_b0;
    }
    if (valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      lVar15 = ::dg::getConstructedFunctions();
      p_Var13 = *(_Rb_tree_node_base **)(lVar15 + 0x18);
      local_78 = (_Rb_tree_node_base *)(lVar15 + 8);
      if (p_Var13 != local_78) {
        do {
          lVar15 = *(long *)(*(long *)(p_Var13 + 1) + 0x50);
          local_c0 = *(long *)(p_Var13 + 1) + 0x48;
          if (lVar15 == local_c0) {
            lVar22 = 0;
          }
          else {
            do {
              lVar17 = lVar15 + -0x18;
              if (lVar15 == 0) {
                lVar17 = 0;
              }
              lVar22 = *(long *)(lVar17 + 0x30);
            } while ((lVar22 == lVar17 + 0x28) &&
                    (lVar15 = *(long *)(lVar15 + 8), lVar15 != local_c0));
          }
          local_c8 = p_Var13;
          if (lVar15 != local_c0) {
            do {
              ppVar6 = ppStack_b0;
              I = (Instruction *)(lVar22 + -0x18);
              if (lVar22 == 0) {
                I = (Instruction *)0x0;
              }
              bVar25 = local_b8 != (undefined1  [8])ppStack_b0;
              local_70 = lVar15;
              local_68 = lVar22;
              if (bVar25) {
                p_Var13 = (_Rb_tree_node_base *)(I + 0x30);
                bVar25 = true;
                auVar23 = local_b8;
                local_1f0 = p_Var13;
                do {
                  iVar11 = 3;
                  if ((*(long *)p_Var13 != 0) &&
                     (iVar12 = llvm::DebugLoc::getLine(), p_Var7 = local_1f8,
                     iVar12 == *(int *)&((_Alloc_hider *)&((pointer)auVar23)->first)->_M_p)) {
                    bVar26 = instIsCallOf(I,&((pointer)auVar23)->second,
                                          (LLVMPointerAnalysis *)local_1f8[10]._M_parent);
                    if (bVar26) {
                      prVar16 = (raw_ostream *)llvm::errs();
                      puVar1 = *(undefined8 **)(prVar16 + 0x20);
                      if ((ulong)(*(long *)(prVar16 + 0x18) - (long)puVar1) < 0xd) {
                        prVar16 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar16,0x12c7f2);
                      }
                      else {
                        *(undefined8 *)((long)puVar1 + 5) = 0x20656e696c206465;
                        *puVar1 = 0x206465686374614d;
                        *(long *)(prVar16 + 0x20) = *(long *)(prVar16 + 0x20) + 0xd;
                      }
                      pcVar14 = (char *)llvm::raw_ostream::operator<<
                                                  (prVar16,(long)*(int *)&((_Alloc_hider *)
                                                                          &((pointer)auVar23)->first
                                                                          )->_M_p);
                      puVar1 = *(undefined8 **)(pcVar14 + 0x20);
                      p_Var13 = local_1f0;
                      if ((ulong)(*(long *)(pcVar14 + 0x18) - (long)puVar1) < 0xe) {
                        pcVar24 = " with call of ";
LAB_00125afc:
                        pcVar14 = (char *)llvm::raw_ostream::write(pcVar14,(ulong)pcVar24);
                      }
                      else {
                        *(undefined8 *)((long)puVar1 + 6) = 0x20666f206c6c6163;
                        *puVar1 = 0x6163206874697720;
                        *(long *)(pcVar14 + 0x20) = *(long *)(pcVar14 + 0x20) + 0xe;
                      }
                    }
                    else {
                      iVar11 = 0;
                      bVar26 = usesTheVariable(I,&((pointer)auVar23)->second,
                                               p_Var7[10]._M_parent != (_Base_ptr)0x0,
                                               (LLVMPointerAnalysis *)0x0);
                      p_Var13 = local_1f0;
                      if (!bVar26) goto LAB_00125bab;
                      prVar16 = (raw_ostream *)llvm::errs();
                      puVar1 = *(undefined8 **)(prVar16 + 0x20);
                      if ((ulong)(*(long *)(prVar16 + 0x18) - (long)puVar1) < 0xd) {
                        prVar16 = (raw_ostream *)llvm::raw_ostream::write((char *)prVar16,0x12c7f2);
                      }
                      else {
                        *(undefined8 *)((long)puVar1 + 5) = 0x20656e696c206465;
                        *puVar1 = 0x206465686374614d;
                        *(long *)(prVar16 + 0x20) = *(long *)(prVar16 + 0x20) + 0xd;
                      }
                      pcVar14 = (char *)llvm::raw_ostream::operator<<
                                                  (prVar16,(long)*(int *)&((_Alloc_hider *)
                                                                          &((pointer)auVar23)->first
                                                                          )->_M_p);
                      puVar1 = *(undefined8 **)(pcVar14 + 0x20);
                      if ((ulong)(*(long *)(pcVar14 + 0x18) - (long)puVar1) < 0xf) {
                        pcVar24 = " with variable ";
                        goto LAB_00125afc;
                      }
                      *(undefined8 *)((long)puVar1 + 7) = 0x20656c6261697261;
                      *puVar1 = 0x6176206874697720;
                      *(long *)(pcVar14 + 0x20) = *(long *)(pcVar14 + 0x20) + 0xf;
                    }
                    pcVar14 = (char *)llvm::raw_ostream::write
                                                (pcVar14,(ulong)(((pointer)auVar23)->second).
                                                                _M_dataplus._M_p);
                    puVar3 = *(undefined4 **)(pcVar14 + 0x20);
                    if ((ulong)(*(long *)(pcVar14 + 0x18) - (long)puVar3) < 5) {
                      pcVar14 = (char *)llvm::raw_ostream::write(pcVar14,0x12c7ec);
                    }
                    else {
                      *(undefined1 *)(puVar3 + 1) = 10;
                      *puVar3 = 0x3a6f7420;
                      *(long *)(pcVar14 + 0x20) = *(long *)(pcVar14 + 0x20) + 5;
                    }
                    llvm::Value::print((raw_ostream *)I,SUB81(pcVar14,0));
                    if (*(undefined1 **)(pcVar14 + 0x18) == *(undefined1 **)(pcVar14 + 0x20)) {
                      llvm::raw_ostream::write(pcVar14,0x12c650);
                    }
                    else {
                      **(undefined1 **)(pcVar14 + 0x20) = 10;
                      *(long *)(pcVar14 + 0x20) = *(long *)(pcVar14 + 0x20) + 1;
                    }
                    iVar11 = 1;
                  }
LAB_00125bab:
                  if ((iVar11 != 3) && (iVar11 != 0)) break;
                  auVar23 = (undefined1  [8])((long)auVar23 + 0x28);
                  bVar25 = auVar23 != (undefined1  [8])ppVar6;
                } while (bVar25);
              }
              if (bVar25) {
                local_188._0_8_ =
                     ::dg::DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
                               ((DependenceGraph<dg::LLVMNode> *)local_c8[1]._M_parent,(Value *)I);
                std::
                _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                ::_M_insert_unique<dg::LLVMNode*const&>
                          ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                            *)&local_1b8,(LLVMNode **)local_188);
              }
              lVar22 = *(long *)(local_68 + 8);
              lVar17 = local_70 + -0x18;
              if (local_70 == 0) {
                lVar17 = 0;
              }
              lVar15 = local_70;
              if (lVar22 == lVar17 + 0x28) {
                for (lVar15 = *(long *)(local_70 + 8); lVar15 != local_c0;
                    lVar15 = *(long *)(lVar15 + 8)) {
                  lVar17 = lVar15 + -0x18;
                  if (lVar15 == 0) {
                    lVar17 = 0;
                  }
                  lVar22 = *(long *)(lVar17 + 0x30);
                  if (lVar22 != lVar17 + 0x28) break;
                }
              }
            } while (lVar15 != local_c0);
          }
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_c8);
        } while (p_Var13 != local_78);
      }
    }
    std::
    vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_b8);
  }
  if (((char)local_11c == '\0') ||
     ((pointer)local_1b8._M_impl.super__Rb_tree_header._M_node_count == (pointer)0x0))
  goto LAB_00125eb0;
  p_Var13 = (_Rb_tree_node_base *)(local_188 + 8);
  local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
  local_178._0_8_ = (_Link_type)0x0;
  aStack_168._8_8_ = (pointer)0x0;
  local_178._8_8_ = p_Var13;
  aStack_168._M_allocated_capacity = (size_type)p_Var13;
  if ((_Rb_tree_header *)local_1b8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_1b8._M_impl.super__Rb_tree_header) {
    p_Var18 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      V = (Value *)**(long **)(p_Var18 + 1);
      if ((byte)V[0x10] < 0x1b) {
        V = (Value *)0x0;
      }
      lVar15 = *(long *)(V + 0x20);
      if ((lVar15 == *(long *)(V + 0x28) + 0x28) || (lVar15 == 0)) {
        prVar16 = (raw_ostream *)llvm::errs();
        prVar16 = llvm::operator<<(prVar16,V);
        llvm::raw_ostream::operator<<(prVar16,"has no successor that could be criterion\n");
        abort();
      }
      local_b8 = (undefined1  [8])
                 ::dg::DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
                           ((DependenceGraph<dg::LLVMNode> *)(*(long **)(p_Var18 + 1))[1],
                            (Value *)(lVar15 + -0x18));
      std::
      _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
      ::_M_insert_unique<dg::LLVMNode*const&>
                ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                  *)local_188,(LLVMNode **)local_b8);
      p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
    } while ((_Rb_tree_header *)p_Var18 != &local_1b8._M_impl.super__Rb_tree_header);
  }
  uVar10 = aStack_168._M_allocated_capacity;
  uVar9 = local_178._8_8_;
  uVar8 = local_178._0_8_;
  if ((_Link_type)local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Link_type)0x0) {
    if ((_Link_type)local_178._0_8_ != (_Link_type)0x0) {
      local_1b8._M_impl.super__Rb_tree_header._M_header._M_color = local_188._8_4_;
      *(_Rb_tree_header **)(local_178._0_8_ + 8) = &local_1b8._M_impl.super__Rb_tree_header;
      pbVar19 = (pointer)0x0;
      local_178._0_8_ = (_Link_type)0x0;
      local_178._8_8_ = p_Var13;
      aStack_168._M_allocated_capacity = (size_type)p_Var13;
      goto LAB_00125e37;
    }
  }
  else if ((_Link_type)local_178._0_8_ == (_Link_type)0x0) {
    local_188._8_4_ = local_1b8._M_impl.super__Rb_tree_header._M_header._M_color;
    local_178._0_8_ = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_178._8_8_ = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
    aStack_168._M_allocated_capacity =
         (size_type)local_1b8._M_impl.super__Rb_tree_header._M_header._M_right;
    ((_Rb_tree_node_base *)&(local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_color)
    ->_M_parent = p_Var13;
    aStack_168._8_8_ = local_1b8._M_impl.super__Rb_tree_header._M_node_count;
    local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1b8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1b8._M_impl.super__Rb_tree_header._M_header;
    local_1b8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1b8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    local_178._0_8_ = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_178._8_8_ = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
    aStack_168._M_allocated_capacity =
         (size_type)local_1b8._M_impl.super__Rb_tree_header._M_header._M_right;
    *(_Rb_tree_header **)(uVar8 + 8) = &local_1b8._M_impl.super__Rb_tree_header;
    ((_Rb_tree_node_base *)&(local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_color)
    ->_M_parent = p_Var13;
    pbVar19 = (pointer)local_1b8._M_impl.super__Rb_tree_header._M_node_count;
LAB_00125e37:
    local_1b8._M_impl.super__Rb_tree_header._M_node_count = aStack_168._8_8_;
    local_1b8._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar10;
    local_1b8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)uVar9;
    local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)uVar8;
    aStack_168._8_8_ = pbVar19;
  }
  std::
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  ::_M_erase((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
              *)local_188,(_Link_type)local_178._0_8_);
LAB_00125eb0:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  if ((pointer)local_1b8._M_impl.super__Rb_tree_header._M_node_count != (pointer)0x0) {
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::swap((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
            *)local_1e8,&local_1b8);
    splitList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60,local_80,',');
    p_Stack_100 = (_Base_ptr)(local_118 + 8);
    local_118._8_8_ = local_118._8_8_ & 0xffffffff00000000;
    local_108 = (_Link_type)0x0;
    pppBStack_f0 = (_Map_pointer)0x0;
    ppStack_b0 = (pointer)((ulong)ppStack_b0 & 0xffffffff00000000);
    local_a8 = (_Link_type)0x0;
    local_90 = 0;
    local_f8 = p_Stack_100;
    local_a0 = (_Base_ptr)&ppStack_b0;
    local_98 = (_Base_ptr)&ppStack_b0;
    if (local_60 != (undefined1  [8])local_58._0_8_) {
      auVar23 = local_60;
      do {
        uVar21 = ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar23)->
                 _M_string_length;
        if (((uVar21 < 3) ||
            (pcVar4 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar23
                       )->_M_dataplus)._M_p, pcVar4[uVar21 - 2] != '(')) ||
           (pcVar4[uVar21 - 1] != ')')) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar23);
        }
        else {
          std::__cxx11::string::substr((ulong)local_188,(ulong)auVar23);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188)
          ;
          if ((pointer)local_188._0_8_ != (pointer)local_178) {
            operator_delete((void *)local_188._0_8_,(ulong)(local_178._0_8_ + 1));
          }
        }
        auVar23 = (undefined1  [8])((long)auVar23 + 0x20);
      } while (auVar23 != (undefined1  [8])local_58._0_8_);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_188,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_118);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree(&local_158,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b8,local_a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_118,local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
    ppStack_b0 = (pointer)((ulong)ppStack_b0 & 0xffffffff00000000);
    local_a8 = (_Link_type)0x0;
    local_90 = 0;
    local_d8 = (_Base_ptr)0x0;
    pppBStack_d0 = (_Map_pointer)0x0;
    local_e8 = (_Base_ptr)0x0;
    p_Stack_e0 = (_Base_ptr)0x0;
    local_f8 = (_Base_ptr)0x0;
    pppBStack_f0 = (_Map_pointer)0x0;
    local_108 = (_Link_type)0x0;
    p_Stack_100 = (_Base_ptr)0x0;
    local_118._0_8_ = (void *)0x0;
    local_118._8_8_ = 0;
    local_a0 = (_Base_ptr)&ppStack_b0;
    local_98 = (_Base_ptr)&ppStack_b0;
    std::_Deque_base<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>::
    _M_initialize_map((_Deque_base<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                       *)local_118,0);
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::_Rb_tree((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                *)local_60,
               (_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                *)local_1e8);
    if (local_58._M_left != &local_58) {
      p_Var13 = local_58._M_left;
      do {
        pbVar19 = *(pointer *)(*(long *)(p_Var13 + 1) + 0x1d0);
        if (pbVar19 != (pointer)0x0) {
          if (local_e8 == (_Base_ptr)&local_d8[-1]._M_right) {
            local_218.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = pbVar19;
            std::deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>::
            _M_push_back_aux<dg::BBlock<dg::LLVMNode>*const&>
                      ((deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>> *
                       )local_118,(BBlock<dg::LLVMNode> **)&local_218);
          }
          else {
            *(pointer *)local_e8 = pbVar19;
            local_e8 = (_Base_ptr)&local_e8->_M_parent;
          }
          local_218.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(*(long *)(p_Var13 + 1) + 0x1d0);
          std::
          _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
          ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*>
                    ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                      *)local_b8,(BBlock<dg::LLVMNode> **)&local_218);
          lVar15 = *(long *)(*(long *)(p_Var13 + 1) + 0x1d0);
          p_Var7 = p_Var13;
          for (puVar1 = *(undefined8 **)(lVar15 + 0x10);
              (puVar1 != (undefined8 *)(lVar15 + 0x10) &&
              (psVar5 = (string *)puVar1[2], local_1f0 = p_Var7, psVar5 != *(string **)(p_Var13 + 1)
              )); puVar1 = (undefined8 *)*puVar1) {
            if (*(long *)((long)&psVar5[0xd].field_2 + 8) != 0) {
              for (p_Var13 = (_Rb_tree_node_base *)psVar5[0xd]._M_string_length;
                  p_Var13 != (_Rb_tree_node_base *)((long)&psVar5[0xc].field_2 + 8);
                  p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
                local_218.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     *(pointer *)(*(long *)(p_Var13 + 1) + 0x98);
                pVar28 = std::
                         _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                         ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                                   ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                                     *)local_b8,(BBlock<dg::LLVMNode> **)&local_218);
                if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  if (local_e8 == (_Base_ptr)&local_d8[-1]._M_right) {
                    std::deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                    ::_M_push_back_aux<dg::BBlock<dg::LLVMNode>*const&>
                              ((deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                                *)local_118,(BBlock<dg::LLVMNode> **)&local_218);
                  }
                  else {
                    *(pointer *)local_e8 =
                         local_218.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                    local_e8 = (_Base_ptr)&local_e8->_M_parent;
                  }
                }
              }
            }
            local_218.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = psVar5;
            bVar25 = isCallTo((LLVMNode *)psVar5,
                              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_188);
            if (bVar25) {
              std::
              _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
              ::_M_insert_unique<dg::LLVMNode*const&>(local_1e8,(LLVMNode **)&local_218);
            }
            bVar25 = isCallTo((LLVMNode *)
                              local_218.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_158);
            p_Var13 = local_1f0;
            if (bVar25) {
              std::
              _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
              ::_M_insert_unique<dg::LLVMNode*const&>(local_1e8,(LLVMNode **)&local_218);
            }
            p_Var7 = local_1f0;
          }
        }
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != &local_58);
    }
    if ((_Link_type)local_e8 != local_108) {
      do {
        p_Var18 = local_e8;
        if (local_e8 == p_Stack_e0) {
          p_Var18 = (_Base_ptr)(pppBStack_d0[-1] + 0x40);
        }
        p_Var18 = p_Var18[-1]._M_right;
        if (local_e8 == p_Stack_e0) {
          operator_delete(p_Stack_e0,0x200);
          p_Stack_e0 = (_Base_ptr)pppBStack_d0[-1];
          local_d8 = p_Stack_e0 + 0x10;
          local_e8 = p_Stack_e0 + 0xf;
          pppBStack_d0 = pppBStack_d0 + -1;
        }
        else {
          local_e8 = local_e8 + -1;
        }
        local_e8 = (_Base_ptr)&local_e8->_M_right;
        p_Var13 = p_Var18[3]._M_left;
        local_1f8 = p_Var18 + 3;
        if (p_Var13 != local_1f8) {
          do {
            local_1d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(p_Var13 + 1);
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&((_Base_ptr)
                          local_1d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_left;
            local_1f0 = p_Var13;
            for (puVar1 = (undefined8 *)
                          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)&((_Base_ptr)
                               local_1d8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_left)->
                          _M_allocated_capacity;
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar1 != paVar20; puVar1 = (undefined8 *)*puVar1) {
              psVar5 = (string *)puVar1[2];
              if (*(long *)((long)&psVar5[0xd].field_2 + 8) != 0) {
                for (p_Var13 = (_Rb_tree_node_base *)psVar5[0xd]._M_string_length;
                    p_Var13 != (_Rb_tree_node_base *)((long)&psVar5[0xc].field_2 + 8);
                    p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
                  local_218.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       *(pointer *)(*(long *)(p_Var13 + 1) + 0x98);
                  pVar28 = std::
                           _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                           ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                                     ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                                       *)local_b8,(BBlock<dg::LLVMNode> **)&local_218);
                  if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    if (local_e8 == (_Base_ptr)&local_d8[-1]._M_right) {
                      std::
                      deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>::
                      _M_push_back_aux<dg::BBlock<dg::LLVMNode>*const&>
                                ((deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                                  *)local_118,(BBlock<dg::LLVMNode> **)&local_218);
                    }
                    else {
                      *(pointer *)local_e8 =
                           local_218.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                      local_e8 = (_Base_ptr)&local_e8->_M_parent;
                    }
                  }
                }
              }
              local_218.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = psVar5;
              bVar25 = isCallTo((LLVMNode *)psVar5,
                                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_188);
              if (bVar25) {
                std::
                _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                ::_M_insert_unique<dg::LLVMNode*const&>(local_1e8,(LLVMNode **)&local_218);
              }
              bVar25 = isCallTo((LLVMNode *)
                                local_218.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_158);
              if (bVar25) {
                std::
                _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                ::_M_insert_unique<dg::LLVMNode*const&>(local_1e8,(LLVMNode **)&local_218);
              }
            }
            pVar28 = std::
                     _Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                     ::_M_insert_unique<dg::BBlock<dg::LLVMNode>*const&>
                               ((_Rb_tree<dg::BBlock<dg::LLVMNode>*,dg::BBlock<dg::LLVMNode>*,std::_Identity<dg::BBlock<dg::LLVMNode>*>,std::less<dg::BBlock<dg::LLVMNode>*>,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                                 *)local_b8,(BBlock<dg::LLVMNode> **)&local_1d8);
            if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if (local_e8 == (_Base_ptr)&local_d8[-1]._M_right) {
                std::deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>::
                _M_push_back_aux<dg::BBlock<dg::LLVMNode>*const&>
                          ((deque<dg::BBlock<dg::LLVMNode>*,std::allocator<dg::BBlock<dg::LLVMNode>*>>
                            *)local_118,(BBlock<dg::LLVMNode> **)&local_1d8);
              }
              else {
                *(pointer *)local_e8 =
                     local_1d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_e8 = (_Base_ptr)&local_e8->_M_parent;
              }
            }
            p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_1f0);
          } while (p_Var13 != local_1f8);
        }
      } while ((_Link_type)local_e8 != local_108);
    }
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::_M_erase((_Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                *)local_60,(_Link_type)local_58._M_parent);
    std::_Deque_base<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>::
    ~_Deque_base((_Deque_base<dg::BBlock<dg::LLVMNode>_*,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                  *)local_118);
    std::
    _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
    ::_M_erase((_Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                *)local_b8,(_Link_type)local_a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_158,(_Link_type)local_158._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_188,(_Link_type)local_178._0_8_);
  }
  std::
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  ::_M_erase(&local_1b8,(_Link_type)local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent);
  return true;
}

Assistant:

bool getSlicingCriteriaNodes(LLVMDependenceGraph &dg,
                             const std::string &slicingCriteria,
                             const std::string &secondarySlicingCriteria,
                             std::set<LLVMNode *> &criteria_nodes,
                             bool criteria_are_next_instr) {
    auto nodes = getPrimarySlicingCriteriaNodes(dg, slicingCriteria,
                                                criteria_are_next_instr);
    if (nodes.empty()) {
        return true; // no criteria found
    }

    criteria_nodes.swap(nodes);

    auto secondaryCriteria =
            parseSecondarySlicingCriteria(secondarySlicingCriteria);
    const auto &secondaryControlCriteria = secondaryCriteria.first;
    const auto &secondaryDataCriteria = secondaryCriteria.second;

    // mark nodes that are going to be in the slice
    if (!findSecondarySlicingCriteria(criteria_nodes, secondaryControlCriteria,
                                      secondaryDataCriteria)) {
        llvm::errs() << "Finding secondary slicing criteria nodes failed\n";
        return false;
    }

    return true;
}